

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

void __thiscall cmFileAPI::WriteReplies(cmFileAPI *this)

{
  allocator<char> local_b1;
  string local_b0;
  Value local_90;
  string local_68;
  Status local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  cmFileAPI *local_10;
  cmFileAPI *this_local;
  
  local_10 = this;
  if ((this->QueryExists & 1U) != 0) {
    std::operator+(&local_30,&this->APIv1,"/reply");
    local_44 = cmsys::SystemTools::MakeDirectory(&local_30,(mode_t *)0x0);
    std::__cxx11::string::~string((string *)&local_30);
    BuildReplyIndex(&local_90,this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"index",&local_b1);
    WriteJsonFile(&local_68,this,&local_90,&local_b0,ComputeSuffixTime);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    Json::Value::~Value(&local_90);
  }
  RemoveOldReplyFiles(this);
  return;
}

Assistant:

void cmFileAPI::WriteReplies()
{
  if (this->QueryExists) {
    cmSystemTools::MakeDirectory(this->APIv1 + "/reply");
    this->WriteJsonFile(this->BuildReplyIndex(), "index", ComputeSuffixTime);
  }

  this->RemoveOldReplyFiles();
}